

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (UnknownFieldLiteParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte *ptr_00;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  byte *unaff_R12;
  byte *local_28;
  
  local_28 = (byte *)ptr;
  do {
    bVar2 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_28,ctx->group_depth_);
    if (bVar2) {
      return (char *)local_28;
    }
    bVar1 = *local_28;
    ptr_00 = local_28 + 1;
    uVar3 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar5 = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
      if ((char)*ptr_00 < '\0') {
        lVar6 = -0x15;
        pbVar4 = local_28 + 3;
        do {
          ptr_00 = pbVar4;
          uVar5 = (ptr_00[-1] - 1 << ((char)lVar6 + 0x23U & 0x1f)) + uVar5;
          uVar3 = uVar5;
          if (-1 < (char)ptr_00[-1]) break;
          pbVar4 = ptr_00 + 1;
          ptr_00 = (byte *)0x0;
          lVar6 = lVar6 + 7;
          uVar3 = 0;
        } while (lVar6 != 0);
      }
      else {
        ptr_00 = local_28 + 2;
        uVar3 = uVar5;
      }
    }
    local_28 = ptr_00;
    if (ptr_00 == (byte *)0x0) {
      unaff_R12 = (byte *)0x0;
LAB_0038b278:
      bVar2 = false;
    }
    else {
      if (uVar3 == 0 || (uVar3 & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar3 - 1;
        unaff_R12 = ptr_00;
        goto LAB_0038b278;
      }
      local_28 = (byte *)FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                                   ((ulong)uVar3,field_parser,(char *)ptr_00,ctx);
      bVar2 = local_28 != (byte *)0x0;
      if (!bVar2) {
        unaff_R12 = (byte *)0x0;
      }
    }
    if (!bVar2) {
      return (char *)unaff_R12;
    }
  } while( true );
}

Assistant:

PROTOBUF_NODISCARD const char* WireFormatParser(T& field_parser,
                                                const char* ptr,
                                                ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}